

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_compareScalingFactorWithNullptrAsBothParameters_Test::TestBody
          (Units_compareScalingFactorWithNullptrAsBothParameters_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_c0 [8];
  Message local_b8 [8];
  shared_ptr<libcellml::Units> local_b0;
  shared_ptr<libcellml::Units> local_a0;
  double local_90;
  double local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [24];
  shared_ptr<libcellml::Units> local_50;
  shared_ptr<libcellml::Units> local_40;
  double local_30;
  double local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  Units_compareScalingFactorWithNullptrAsBothParameters_Test *this_local;
  
  local_28 = 0.0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  std::shared_ptr<libcellml::Units>::shared_ptr(&local_40,(nullptr_t)0x0);
  std::shared_ptr<libcellml::Units>::shared_ptr(&local_50,(nullptr_t)0x0);
  local_30 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)&local_40,(shared_ptr *)&local_50,true);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_20,"0.0","libcellml::Units::scalingFactor(nullptr, nullptr)",
             &local_28,&local_30);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_50);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x447,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_88 = 0.0;
  std::shared_ptr<libcellml::Units>::shared_ptr(&local_a0,(nullptr_t)0x0);
  std::shared_ptr<libcellml::Units>::shared_ptr(&local_b0,(nullptr_t)0x0);
  local_90 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)&local_a0,(shared_ptr *)&local_b0,false);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_80,"0.0",
             "libcellml::Units::scalingFactor(nullptr, nullptr, false)",&local_88,&local_90);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_b0);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x448,pcVar2);
    testing::internal::AssertHelper::operator=(local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    testing::Message::~Message(local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  return;
}

Assistant:

TEST(Units, compareScalingFactorWithNullptrAsBothParameters)
{
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(nullptr, nullptr));
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(nullptr, nullptr, false));
}